

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2_hard.cpp
# Opt level: O3

void anon_unknown.dwarf_ef25d::cross_off
               (BitSieve *sieve,int64_t low,int64_t high,int64_t prime,WheelItem *w)

{
  pointer *ppuVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  
  cVar2 = w->wheel_index;
  for (lVar3 = w->next_multiple; lVar3 < high;
      lVar3 = lVar3 + (char)primesum::Wheel::next[lVar4 * 2] * prime) {
    lVar4 = (long)cVar2;
    ppuVar1 = &(sieve->sieve_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + ((ulong)(lVar3 - low) >> 7);
    *ppuVar1 = (pointer)((ulong)*ppuVar1 &
                        ~(&primesum::BitSieve::set_bit_)[(uint)(lVar3 - low) & 0x7f]);
    cVar2 = primesum::Wheel::next[lVar4 * 2 + 1];
  }
  w->next_multiple = lVar3;
  w->wheel_index = cVar2;
  return;
}

Assistant:

int128_t cross_off(BitSieve& sieve,
                   int64_t low,
                   int64_t high,
                   int64_t prime,
                   WheelItem& w)
{
  int64_t m = w.next_multiple;
  int64_t wheel_index = w.wheel_index;
  int128_t sum = 0;

  for (; m < high; m += prime * Wheel::next_multiple_factor(&wheel_index))
  {
    sum += m * sieve[m - low];
    sieve.unset(m - low);
  }

  w.set(m, wheel_index);
  return sum;
}